

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O2

REF_STATUS
distance_metric_fill(REF_GRID_conflict ref_grid,REF_DICT ref_dict_bcs,int argc,char **argv)

{
  size_t sVar1;
  REF_NODE pRVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  REF_INT n;
  REF_INT RVar7;
  REF_GRID_conflict pRVar8;
  REF_DICT ref_dict;
  uint uVar9;
  uint uVar10;
  int iVar11;
  REF_STATUS RVar12;
  REF_DICT distance;
  FILE *__stream;
  char *pcVar13;
  REF_DBL *pRVar14;
  REF_DBL *pRVar15;
  undefined8 uVar16;
  REF_MPI pRVar17;
  long lVar18;
  char *pcVar19;
  char cVar20;
  long lVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined4 uVar28;
  REF_INT n_tab;
  char local_529;
  REF_MPI local_528;
  REF_INT pos;
  REF_DBL *local_518;
  REF_DBL *local_510;
  REF_DBL *local_508;
  REF_GRID_conflict local_500;
  REF_DICT local_4f8;
  REF_DBL *local_4f0;
  double local_4e8;
  double local_4e0;
  REF_DBL h;
  REF_NODE local_4d0;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  double local_4a8;
  undefined8 uStack_4a0;
  double local_498;
  undefined8 uStack_490;
  undefined1 local_488 [16];
  REF_INT local_46c;
  REF_DBL h_1;
  undefined8 local_460;
  undefined8 uStack_458;
  double local_450;
  undefined8 local_448;
  double local_440;
  char line [1024];
  
  local_528 = ref_grid->mpi;
  pRVar2 = ref_grid->node;
  n_tab = 0;
  uVar9 = ref_args_find(argc,argv,"--aspect-ratio",&pos);
  uVar22 = (ulong)uVar9;
  if ((uVar9 != 0) && (uVar9 != 5)) {
    pcVar19 = "arg search";
    uVar16 = 0x1ac;
    goto LAB_001233ea;
  }
  iVar11 = argc + -1;
  local_4f8 = ref_dict_bcs;
  local_4d0 = pRVar2;
  if (pos < iVar11 && pos != -1) {
    dVar23 = atof(argv[(long)pos + 1]);
    local_4e0 = 1.0;
    if (1.0 <= dVar23) {
      local_4e0 = dVar23;
    }
    if (local_528->id == 0) {
      printf("limit --aspect-ratio to %f for --stepexp\n",local_4e0);
    }
  }
  else {
    local_4e0 = 1.0;
  }
  uVar10 = ref_args_find(argc,argv,"--stepexp",&pos);
  if ((uVar10 != 0) && (uVar10 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1b5,"distance_metric_fill",(ulong)uVar10,"arg search");
    uVar9 = uVar10;
  }
  RVar7 = pos;
  if ((uVar10 != 5) && (uVar10 != 0)) {
    return uVar9;
  }
  lVar21 = (long)pos;
  local_500 = ref_grid;
  if (lVar21 == -1) {
    local_4f0 = (REF_DBL *)((ulong)local_4f0 & 0xffffffff00000000);
    local_4e8 = 0.0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_4c8._8_8_;
    local_4c8 = auVar4 << 0x40;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_4b8._8_8_;
    local_4b8 = auVar5 << 0x40;
    local_4a8 = 0.0;
    local_498 = 0.0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_488._8_8_;
    local_488 = auVar6 << 0x40;
  }
  else {
    if (argc <= pos + 6) {
      pcVar19 = "not enough --stepexp args";
      uVar16 = 0x1b8;
      goto LAB_00123b1c;
    }
    local_488._0_8_ = atof(argv[lVar21 + 1]);
    local_498 = atof(argv[lVar21 + 2]);
    local_4a8 = atof(argv[lVar21 + 3]);
    local_4b8._0_8_ = atof(argv[lVar21 + 4]);
    local_4c8._0_8_ = atof(argv[lVar21 + 5]);
    dVar23 = atof(argv[lVar21 + 6]);
    if (local_528->id == 0) {
      local_4e8 = dVar23;
      printf("h0 %f h1 %f h2 %f s1 %f s2 %f width %f\n",local_488._0_8_,local_498,SUB84(local_4a8,0)
             ,local_4b8._0_4_,local_4c8._0_8_,dVar23);
      dVar23 = local_4e8;
    }
    if ((double)local_488._0_8_ <= 0.0) {
      pcVar19 = "positive h0";
      uVar16 = 0x1c2;
      goto LAB_00123b1c;
    }
    if (local_498 <= 0.0) {
      pcVar19 = "positive h1";
      uVar16 = 0x1c3;
      goto LAB_00123b1c;
    }
    if (local_4a8 <= 0.0) {
      pcVar19 = "positive h2";
      uVar16 = 0x1c4;
      goto LAB_00123b1c;
    }
    if ((double)local_4b8._0_8_ <= 0.0) {
      pcVar19 = "positive s1";
      uVar16 = 0x1c5;
      goto LAB_00123b1c;
    }
    if ((double)local_4c8._0_8_ <= 0.0) {
      pcVar19 = "positive s2";
      uVar16 = 0x1c6;
      goto LAB_00123b1c;
    }
    if (dVar23 <= 0.0) {
      pcVar19 = "positive width";
      uVar16 = 0x1c7;
      goto LAB_00123a7e;
    }
    local_4f0 = (REF_DBL *)CONCAT44(local_4f0._4_4_,1);
    local_4e8 = dVar23;
  }
  uVar10 = ref_args_find(argc,argv,"--spacing-table",&pos);
  if ((uVar10 != 0) && (uVar10 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1cb,"distance_metric_fill",(ulong)uVar10,"metric arg search");
    uVar9 = uVar10;
  }
  if ((uVar10 != 5) && (uVar10 != 0)) {
    return uVar9;
  }
  cVar20 = iVar11 <= pos || pos == -1;
  if (iVar11 <= pos || pos == -1) {
    local_518 = (REF_DBL *)0x0;
    iVar11 = 0;
    pRVar14 = (REF_DBL *)0x0;
    pRVar15 = (REF_DBL *)0x0;
  }
  else {
    if (local_528->id == 0) {
      pcVar19 = argv[(long)pos + 1];
      __stream = fopen(pcVar19,"r");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",pcVar19);
        pcVar19 = "unable to open file";
        uVar16 = 0x1d6;
        goto LAB_00123bc5;
      }
      n_tab = 0;
      local_529 = cVar20;
      while (pcVar13 = fgets(line,0x400,__stream), line == pcVar13) {
        pcVar13 = strtok(line," ");
        uVar9 = 0;
        while (pcVar13 != (char *)0x0) {
          uVar9 = uVar9 + 1;
          pcVar13 = strtok((char *)0x0," ");
        }
        if (1 < uVar9) {
          n_tab = n_tab + 1;
        }
      }
      printf(" %d breakpoints in %s\n",(ulong)(uint)n_tab,pcVar19);
      lVar21 = (long)n_tab;
      if (lVar21 < 0) {
        pcVar19 = "malloc tab_dist of REF_DBL negative";
        uVar16 = 0x1e2;
LAB_00123a7e:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,uVar16,"distance_metric_fill",pcVar19);
        return 1;
      }
      sVar1 = lVar21 * 8;
      pRVar14 = (REF_DBL *)malloc(sVar1);
      if (pRVar14 == (REF_DBL *)0x0) {
        pcVar19 = "malloc tab_dist of REF_DBL NULL";
        uVar16 = 0x1e2;
        goto LAB_00123bc5;
      }
      for (lVar18 = 0; lVar21 != lVar18; lVar18 = lVar18 + 1) {
        pRVar14[lVar18] = 0.0;
      }
      local_510 = pRVar14;
      pRVar14 = (REF_DBL *)malloc(sVar1);
      if (pRVar14 == (REF_DBL *)0x0) {
        pcVar19 = "malloc tab_h of REF_DBL NULL";
        uVar16 = 0x1e3;
        goto LAB_00123bc5;
      }
      for (lVar18 = 0; lVar21 != lVar18; lVar18 = lVar18 + 1) {
        pRVar14[lVar18] = 0.0;
      }
      local_508 = pRVar14;
      local_518 = (REF_DBL *)malloc(sVar1);
      if (local_518 == (REF_DBL *)0x0) {
        pcVar19 = "malloc tab_ar of REF_DBL NULL";
        uVar16 = 0x1e4;
        goto LAB_00123bc5;
      }
      for (lVar18 = 0; lVar21 != lVar18; lVar18 = lVar18 + 1) {
        local_518[lVar18] = 1.0;
      }
      iVar11 = fseek(__stream,0,0);
      if (iVar11 != 0) {
        pcVar19 = "rewind";
        uVar16 = 0x1e5;
        goto LAB_00123a7e;
      }
      local_46c = n_tab;
      n_tab = 0;
      while ((pcVar19 = fgets(line,0x400,__stream), line == pcVar19 && (n_tab < local_46c))) {
        pcVar19 = strtok(line," ");
        uVar9 = 0;
        while (pcVar19 != (char *)0x0) {
          pRVar14 = local_518;
          if (((uVar9 == 2) || (pRVar14 = local_508, uVar9 == 1)) ||
             (pRVar14 = local_510, uVar9 == 0)) {
            dVar23 = atof(pcVar19);
            pRVar14[n_tab] = dVar23;
          }
          uVar9 = uVar9 + 1;
          pcVar19 = strtok((char *)0x0," ");
        }
        if (1 < uVar9) {
          lVar21 = (long)n_tab;
          printf(" %f %f %f %d\n",local_510[lVar21],local_508[lVar21],SUB84(local_518[lVar21],0));
          n_tab = n_tab + 1;
        }
      }
      fclose(__stream);
      uVar9 = ref_mpi_bcast(local_528,&n_tab,1,1);
      pRVar17 = local_528;
      if (uVar9 != 0) {
        uVar16 = 0x1f9;
        goto LAB_00123596;
      }
      if (n_tab < 3) {
        uVar16 = 0x1fa;
        goto LAB_0012384e;
      }
      uVar9 = ref_mpi_bcast(local_528,local_510,n_tab,3);
      if (uVar9 != 0) {
        uVar22 = (ulong)uVar9;
        pcVar19 = "n_tab";
        uVar16 = 0x1fc;
        goto LAB_001233ea;
      }
      uVar9 = ref_mpi_bcast(pRVar17,local_508,n_tab,3);
      if (uVar9 != 0) {
        uVar22 = (ulong)uVar9;
        pcVar19 = "n_tab";
        uVar16 = 0x1fd;
        goto LAB_001233ea;
      }
      uVar9 = ref_mpi_bcast(local_528,local_518,n_tab,3);
      if (uVar9 != 0) {
        uVar22 = (ulong)uVar9;
        pcVar19 = "n_tab";
        uVar16 = 0x1fe;
        goto LAB_001233ea;
      }
    }
    else {
      uVar9 = ref_mpi_bcast(local_528,&n_tab,1,1);
      n = n_tab;
      if (uVar9 != 0) {
        uVar16 = 0x200;
LAB_00123596:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,uVar16,"distance_metric_fill",(ulong)uVar9,"n_tab");
        return uVar9;
      }
      lVar21 = (long)n_tab;
      if (lVar21 < 3) {
        uVar16 = 0x201;
LAB_0012384e:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,uVar16,"distance_metric_fill","table requires 2 entries");
        return 1;
      }
      sVar1 = lVar21 * 8;
      local_529 = cVar20;
      pRVar14 = (REF_DBL *)malloc(sVar1);
      if (pRVar14 == (REF_DBL *)0x0) {
        pcVar19 = "malloc tab_dist of REF_DBL NULL";
        uVar16 = 0x202;
        goto LAB_00123bc5;
      }
      for (lVar18 = 0; lVar21 != lVar18; lVar18 = lVar18 + 1) {
        pRVar14[lVar18] = 0.0;
      }
      local_510 = pRVar14;
      pRVar14 = (REF_DBL *)malloc(sVar1);
      if (pRVar14 == (REF_DBL *)0x0) {
        pcVar19 = "malloc tab_h of REF_DBL NULL";
        uVar16 = 0x203;
        goto LAB_00123bc5;
      }
      for (lVar18 = 0; lVar21 != lVar18; lVar18 = lVar18 + 1) {
        pRVar14[lVar18] = 0.0;
      }
      local_508 = pRVar14;
      local_518 = (REF_DBL *)malloc(sVar1);
      pRVar17 = local_528;
      if (local_518 == (REF_DBL *)0x0) {
        pcVar19 = "malloc tab_ar of REF_DBL NULL";
        uVar16 = 0x204;
        goto LAB_00123bc5;
      }
      for (lVar18 = 0; lVar21 != lVar18; lVar18 = lVar18 + 1) {
        local_518[lVar18] = 1.0;
      }
      uVar9 = ref_mpi_bcast(local_528,local_510,n,3);
      if (uVar9 != 0) {
        uVar22 = (ulong)uVar9;
        pcVar19 = "n_tab";
        uVar16 = 0x206;
        goto LAB_001233ea;
      }
      uVar9 = ref_mpi_bcast(pRVar17,local_508,n_tab,3);
      if (uVar9 != 0) {
        uVar22 = (ulong)uVar9;
        pcVar19 = "n_tab";
        uVar16 = 0x207;
        goto LAB_001233ea;
      }
      uVar9 = ref_mpi_bcast(pRVar17,local_518,n_tab,3);
      if (uVar9 != 0) {
        uVar22 = (ulong)uVar9;
        pcVar19 = "n_tab";
        uVar16 = 0x208;
        goto LAB_001233ea;
      }
    }
    iVar11 = 1;
    pRVar14 = local_510;
    pRVar15 = local_508;
    cVar20 = local_529;
  }
  if ((int)local_4f0 == iVar11) {
    pcVar19 = "set one and only one of --stepexp and --spacing-table";
    uVar16 = 0x20e;
  }
  else {
    if (-1 < (long)local_4d0->max) {
      local_510 = pRVar14;
      local_508 = pRVar15;
      distance = (REF_DICT)malloc((long)local_4d0->max << 3);
      ref_dict = local_4f8;
      pRVar8 = local_500;
      if (distance == (REF_DICT)0x0) {
        pcVar19 = "malloc distance of REF_DBL NULL";
        uVar16 = 0x210;
LAB_00123bc5:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,uVar16,"distance_metric_fill",pcVar19);
        return 2;
      }
      local_4f8 = distance;
      uVar9 = ref_phys_wall_distance(local_500,ref_dict,(REF_DBL *)distance);
      if (uVar9 == 0) {
        ref_mpi_stopwatch_stop(local_528,"wall distance");
        uVar9 = pRVar8->node->max;
        if ((int)uVar9 < 0) {
          pcVar19 = "malloc grad_dist of REF_DBL negative";
          uVar16 = 0x214;
          goto LAB_00123b1c;
        }
        pRVar14 = (REF_DBL *)malloc((ulong)uVar9 * 0x18);
        if (pRVar14 == (REF_DBL *)0x0) {
          pcVar19 = "malloc grad_dist of REF_DBL NULL";
          uVar16 = 0x214;
          goto LAB_00123bc5;
        }
        uVar9 = ref_recon_gradient(local_500,(REF_DBL *)local_4f8,pRVar14,REF_RECON_L2PROJECTION);
        if (uVar9 == 0) {
          local_4f0 = pRVar14;
          if (RVar7 != -1) {
            if (local_4e0 <= 0.0) {
              for (lVar21 = 0; lVar21 < local_500->node->max; lVar21 = lVar21 + 1) {
                if (-1 < local_500->node->global[lVar21]) {
                  uVar9 = ref_metric_step_exp(*(REF_DBL *)(&local_4f8->n + lVar21 * 2),&h_1,
                                              (REF_DBL)local_488._0_8_,local_498,local_4a8,
                                              (REF_DBL)local_4b8._0_8_,(REF_DBL)local_4c8._0_8_,
                                              local_4e8);
                  if (uVar9 != 0) {
                    uVar22 = (ulong)uVar9;
                    pcVar19 = "step exp";
                    uVar16 = 0x239;
                    goto LAB_001233ea;
                  }
                  line._24_8_ = 1.0 / (h_1 * h_1);
                  line[8] = '\0';
                  line[9] = '\0';
                  line[10] = '\0';
                  line[0xb] = '\0';
                  line[0xc] = '\0';
                  line[0xd] = '\0';
                  line[0xe] = '\0';
                  line[0xf] = '\0';
                  line._0_8_ = line._24_8_;
                  line[0x10] = '\0';
                  line[0x11] = '\0';
                  line[0x12] = '\0';
                  line[0x13] = '\0';
                  line[0x14] = '\0';
                  line[0x15] = '\0';
                  line[0x16] = '\0';
                  line[0x17] = '\0';
                  line[0x20] = '\0';
                  line[0x21] = '\0';
                  line[0x22] = '\0';
                  line[0x23] = '\0';
                  line[0x24] = '\0';
                  line[0x25] = '\0';
                  line[0x26] = '\0';
                  line[0x27] = '\0';
                  line._40_8_ = line._24_8_;
                  if ((local_500->twod != 0) &&
                     (uVar9 = ref_matrix_twod_m((REF_DBL *)line), uVar9 != 0)) {
                    uVar22 = (ulong)uVar9;
                    pcVar19 = "enforce 2d";
                    uVar16 = 0x240;
                    goto LAB_001233ea;
                  }
                  uVar9 = ref_node_metric_set(local_4d0,(REF_INT)lVar21,(REF_DBL *)line);
                  if (uVar9 != 0) {
                    uVar22 = (ulong)uVar9;
                    pcVar19 = "set";
                    uVar16 = 0x241;
                    goto LAB_001233ea;
                  }
                }
              }
            }
            else {
              pRVar14 = pRVar14 + 2;
              for (lVar21 = 0; lVar21 < local_500->node->max; lVar21 = lVar21 + 1) {
                if (-1 < local_500->node->global[lVar21]) {
                  uVar9 = ref_metric_step_exp(*(REF_DBL *)(&local_4f8->n + lVar21 * 2),&h,
                                              (REF_DBL)local_488._0_8_,local_498,local_4a8,
                                              (REF_DBL)local_4b8._0_8_,(REF_DBL)local_4c8._0_8_,
                                              local_4e8);
                  if (uVar9 != 0) {
                    uVar22 = (ulong)uVar9;
                    pcVar19 = "step exp";
                    uVar16 = 0x21e;
                    goto LAB_001233ea;
                  }
                  dVar23 = (double)CONCAT44(h._4_4_,h._0_4_);
                  auVar24._0_8_ = dVar23 * dVar23;
                  auVar24._8_8_ = local_4e0 * dVar23 * local_4e0 * dVar23;
                  line._0_16_ = divpd(_DAT_002160d0,auVar24);
                  line._16_8_ = line._8_8_;
                  line._24_8_ = pRVar14[-2];
                  line._32_8_ = pRVar14[-1];
                  line._40_8_ = *pRVar14;
                  RVar12 = ref_math_normalize((REF_DBL *)(line + 0x18));
                  if (RVar12 == 0) {
                    uVar9 = ref_math_orthonormal_system
                                      ((REF_DBL *)(line + 0x18),(REF_DBL *)(line + 0x30),
                                       (REF_DBL *)(line + 0x48));
                    if (uVar9 != 0) {
                      uVar22 = (ulong)uVar9;
                      pcVar19 = "ortho sys";
                      uVar16 = 0x227;
                      goto LAB_001233ea;
                    }
                    uVar9 = ref_matrix_form_m((REF_DBL *)line,&h_1);
                    if (uVar9 != 0) {
                      uVar22 = (ulong)uVar9;
                      pcVar19 = "form m from d";
                      uVar16 = 0x228;
                      goto LAB_001233ea;
                    }
                  }
                  else {
                    h_1 = 1.0 / ((double)CONCAT44(h._4_4_,h._0_4_) *
                                (double)CONCAT44(h._4_4_,h._0_4_));
                    local_460 = 0;
                    uStack_458 = 0;
                    local_448 = 0;
                    local_450 = h_1;
                    local_440 = h_1;
                  }
                  if ((local_500->twod != 0) && (uVar9 = ref_matrix_twod_m(&h_1), uVar9 != 0)) {
                    uVar22 = (ulong)uVar9;
                    pcVar19 = "enforce 2d";
                    uVar16 = 0x231;
                    goto LAB_001233ea;
                  }
                  uVar9 = ref_node_metric_set(local_4d0,(REF_INT)lVar21,&h_1);
                  if (uVar9 != 0) {
                    uVar22 = (ulong)uVar9;
                    pcVar19 = "set";
                    uVar16 = 0x232;
                    goto LAB_001233ea;
                  }
                }
                pRVar14 = pRVar14 + 3;
              }
            }
          }
          if (cVar20 == '\0') {
            pRVar17 = (REF_MPI)(local_4f0 + 2);
            for (lVar21 = 0; pRVar14 = local_510, lVar21 < local_500->node->max; lVar21 = lVar21 + 1
                ) {
              if (-1 < local_500->node->global[lVar21]) {
                local_4e0 = *(double *)(&local_4f8->n + lVar21 * 2);
                local_528 = pRVar17;
                uVar9 = ref_sort_search_dbl(n_tab,local_510,local_4e0,(REF_INT *)&h);
                if (uVar9 != 0) {
                  uVar22 = (ulong)uVar9;
                  pcVar19 = "first index on range";
                  uVar16 = 0x24f;
                  goto LAB_001233ea;
                }
                lVar18 = (long)(int)h._0_4_;
                dVar23 = pRVar14[lVar18];
                dVar25 = pRVar14[lVar18 + 1] - dVar23;
                dVar23 = local_4e0 - dVar23;
                dVar26 = dVar25 * 1e+20;
                if (dVar26 <= -dVar26) {
                  dVar26 = -dVar26;
                }
                dVar3 = dVar23;
                if (dVar23 <= -dVar23) {
                  dVar3 = -dVar23;
                }
                dVar23 = (double)(-(ulong)(dVar3 < dVar26) & (ulong)(dVar23 / dVar25));
                local_498 = 0.0;
                if (0.0 <= dVar23) {
                  local_498 = dVar23;
                }
                if (1.0 <= local_498) {
                  local_498 = 1.0;
                }
                local_4a8 = 1.0 - local_498;
                uStack_490 = 0;
                uStack_4a0 = 0;
                dVar23 = local_518[lVar18] * local_4a8 + local_498 * local_518[lVar18 + 1];
                dVar26 = local_508[lVar18] * local_4a8 + local_498 * local_508[lVar18 + 1];
                uVar28 = (undefined4)((ulong)dVar26 >> 0x20);
                local_4b8._8_4_ = SUB84(dVar26,0);
                local_4b8._0_8_ = dVar23;
                local_4b8._12_4_ = uVar28;
                local_4c8._8_4_ = SUB84(dVar26,0);
                local_4c8._0_8_ = dVar26;
                local_4c8._12_4_ = uVar28;
                auVar27._0_8_ = dVar26 * dVar26;
                auVar27._8_8_ = dVar23 * dVar26 * dVar23 * dVar26;
                local_488 = divpd(_DAT_002160d0,auVar27);
                line._16_8_ = local_488._8_8_;
                line._24_8_ = *(undefined8 *)&local_528[-1].native_alltoallv;
                line._32_8_ = *(undefined8 *)&local_528[-1].timing;
                line._40_8_ = *(undefined8 *)local_528;
                line._0_16_ = local_488;
                RVar12 = ref_math_normalize((REF_DBL *)(line + 0x18));
                if (RVar12 == 0) {
                  uVar9 = ref_math_orthonormal_system
                                    ((REF_DBL *)(line + 0x18),(REF_DBL *)(line + 0x30),
                                     (REF_DBL *)(line + 0x48));
                  if (uVar9 != 0) {
                    uVar22 = (ulong)uVar9;
                    pcVar19 = "ortho sys";
                    uVar16 = 0x262;
                    goto LAB_001233ea;
                  }
                  uVar9 = ref_matrix_form_m((REF_DBL *)line,&h_1);
                  if (uVar9 != 0) {
                    uVar22 = (ulong)uVar9;
                    pcVar19 = "form m from d";
                    uVar16 = 0x263;
                    goto LAB_001233ea;
                  }
                }
                else {
                  h_1 = local_488._0_8_;
                  local_460 = 0;
                  uStack_458 = 0;
                  local_448 = 0;
                  local_450 = h_1;
                  local_440 = h_1;
                }
                if ((local_500->twod != 0) && (uVar9 = ref_matrix_twod_m(&h_1), uVar9 != 0)) {
                  uVar22 = (ulong)uVar9;
                  pcVar19 = "enforce 2d";
                  uVar16 = 0x26c;
                  goto LAB_001233ea;
                }
                uVar9 = ref_node_metric_set(local_4d0,(REF_INT)lVar21,&h_1);
                pRVar17 = local_528;
                if (uVar9 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0x272,"distance_metric_fill",(ulong)uVar9,"set");
                  printf("dist %f h %f ar %f t0 %f t1 %f i0 %d i1 %d\n",local_4e0,(ulong)h._0_4_,
                         lVar18 + 1U & 0xffffffff);
                  printf("tab_h[i0] %f tab_h[i1] %f tab_h[i0] %f tab_h[i1] %f\n",
                         local_510[(int)h._0_4_],local_510[lVar18 + 1],
                         SUB84(local_508[(int)h._0_4_],0),SUB84(local_508[lVar18 + 1],0));
                  return uVar9;
                }
              }
              pRVar17 = (REF_MPI)&pRVar17->start_time;
            }
            free(local_518);
            free(local_508);
            free(local_510);
          }
          free(local_4f0);
          free(local_4f8);
          return 0;
        }
        uVar22 = (ulong)uVar9;
        pcVar19 = "grad dist";
        uVar16 = 0x215;
      }
      else {
        uVar22 = (ulong)uVar9;
        pcVar19 = "wall dist";
        uVar16 = 0x211;
      }
LAB_001233ea:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar16,"distance_metric_fill",uVar22,pcVar19);
      return (REF_STATUS)uVar22;
    }
    pcVar19 = "malloc distance of REF_DBL negative";
    uVar16 = 0x210;
  }
LAB_00123b1c:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
         uVar16,"distance_metric_fill",pcVar19);
  return 1;
}

Assistant:

static REF_STATUS distance_metric_fill(REF_GRID ref_grid, REF_DICT ref_dict_bcs,
                                       int argc, char *argv[]) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *distance;
  REF_INT node;
  REF_INT pos;
  REF_DBL h0 = 0.0, h1 = 0.0, h2 = 0.0, s1 = 0.0, s2 = 0.0, width = 0.0;
  REF_DBL aspect_ratio = 1.0;
  REF_BOOL have_stepexp = REF_FALSE;
  REF_BOOL have_spacing_table = REF_FALSE;
  REF_DBL *grad_dist;
  REF_RECON_RECONSTRUCTION recon = REF_RECON_L2PROJECTION;
  REF_INT n_tab = 0, max_tab;
  REF_DBL *tab_dist = NULL, *tab_h = NULL, *tab_ar = NULL;

  RXS(ref_args_find(argc, argv, "--aspect-ratio", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    aspect_ratio = atof(argv[pos + 1]);
    aspect_ratio = MAX(1.0, aspect_ratio);
    if (ref_mpi_once(ref_mpi))
      printf("limit --aspect-ratio to %f for --stepexp\n", aspect_ratio);
  }

  RXS(ref_args_find(argc, argv, "--stepexp", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    have_stepexp = REF_TRUE;
    RAS(pos + 6 < argc, "not enough --stepexp args");
    h0 = atof(argv[pos + 1]);
    h1 = atof(argv[pos + 2]);
    h2 = atof(argv[pos + 3]);
    s1 = atof(argv[pos + 4]);
    s2 = atof(argv[pos + 5]);
    width = atof(argv[pos + 6]);
    if (ref_mpi_once(ref_mpi))
      printf("h0 %f h1 %f h2 %f s1 %f s2 %f width %f\n", h0, h1, h2, s1, s2,
             width);
    RAS(h0 > 0.0, "positive h0");
    RAS(h1 > 0.0, "positive h1");
    RAS(h2 > 0.0, "positive h2");
    RAS(s1 > 0.0, "positive s1");
    RAS(s2 > 0.0, "positive s2");
    RAS(width > 0.0, "positive width");
  }

  RXS(ref_args_find(argc, argv, "--spacing-table", &pos), REF_NOT_FOUND,
      "metric arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    FILE *file = NULL;
    char line[1024];
    const char *filename = argv[pos + 1];
    const char *token;
    const char space[] = " ";
    REF_INT ncol;
    if (ref_mpi_once(ref_mpi)) {
      file = fopen(filename, "r");
      if (NULL == (void *)file) printf("unable to open %s\n", filename);
      RNS(file, "unable to open file");
      n_tab = 0;
      while (line == fgets(line, 1024, file)) {
        ncol = 0;
        token = strtok(line, space);
        while (token != NULL) {
          ncol++;
          token = strtok(NULL, space);
        }
        if (ncol >= 2) n_tab++;
      }
      printf(" %d breakpoints in %s\n", n_tab, filename);
      ref_malloc_init(tab_dist, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_h, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_ar, n_tab, REF_DBL, 1.0);
      RAS(0 == fseek(file, 0, SEEK_SET), "rewind");
      max_tab = n_tab;
      n_tab = 0;
      while (line == fgets(line, 1024, file) && n_tab < max_tab) {
        ncol = 0;
        token = strtok(line, space);
        while (token != NULL) {
          if (0 == ncol) tab_dist[n_tab] = atof(token);
          if (1 == ncol) tab_h[n_tab] = atof(token);
          if (2 == ncol) tab_ar[n_tab] = atof(token);
          ncol++;
          token = strtok(NULL, space);
        }
        if (ncol >= 2) {
          printf(" %f %f %f %d\n", tab_dist[n_tab], tab_h[n_tab], tab_ar[n_tab],
                 n_tab);
          n_tab++;
        }
      }
      fclose(file);
      RSS(ref_mpi_bcast(ref_mpi, (void *)&n_tab, 1, REF_INT_TYPE), "n_tab");
      RAS(n_tab > 2, "table requires 2 entries");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_dist, n_tab, REF_DBL_TYPE),
          "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_h, n_tab, REF_DBL_TYPE), "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_ar, n_tab, REF_DBL_TYPE), "n_tab");
    } else {
      RSS(ref_mpi_bcast(ref_mpi, (void *)&n_tab, 1, REF_INT_TYPE), "n_tab");
      RAS(n_tab > 2, "table requires 2 entries");
      ref_malloc_init(tab_dist, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_h, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_ar, n_tab, REF_DBL, 1.0);
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_dist, n_tab, REF_DBL_TYPE),
          "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_h, n_tab, REF_DBL_TYPE), "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_ar, n_tab, REF_DBL_TYPE), "n_tab");
    }
    have_spacing_table = REF_TRUE;
  }

  RAS(have_stepexp != have_spacing_table,
      "set one and only one of --stepexp and --spacing-table");

  ref_malloc(distance, ref_node_max(ref_node), REF_DBL);
  RSS(ref_phys_wall_distance(ref_grid, ref_dict_bcs, distance), "wall dist");
  ref_mpi_stopwatch_stop(ref_mpi, "wall distance");

  ref_malloc(grad_dist, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  RSS(ref_recon_gradient(ref_grid, distance, grad_dist, recon), "grad dist");

  if (have_stepexp) {
    if (aspect_ratio > 0.0) {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        REF_DBL m[6];
        REF_DBL d[12];
        REF_DBL h;
        REF_DBL s = distance[node];
        RSS(ref_metric_step_exp(s, &h, h0, h1, h2, s1, s2, width), "step exp");
        ref_matrix_eig(d, 0) = 1.0 / (h * h);
        ref_matrix_eig(d, 1) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
        ref_matrix_eig(d, 2) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
        ref_matrix_vec(d, 0, 0) = grad_dist[0 + 3 * node];
        ref_matrix_vec(d, 1, 0) = grad_dist[1 + 3 * node];
        ref_matrix_vec(d, 2, 0) = grad_dist[2 + 3 * node];
        if (REF_SUCCESS == ref_math_normalize(&(d[3]))) {
          RSS(ref_math_orthonormal_system(&(d[3]), &(d[6]), &(d[9])),
              "ortho sys");
          RSS(ref_matrix_form_m(d, m), "form m from d");
        } else {
          m[0] = 1.0 / (h * h);
          m[1] = 0.0;
          m[2] = 0.0;
          m[3] = 1.0 / (h * h);
          m[4] = 0.0;
          m[5] = 1.0 / (h * h);
        }
        if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
        RSS(ref_node_metric_set(ref_node, node, m), "set");
      }
    } else {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        REF_DBL m[6];
        REF_DBL h;
        REF_DBL s = distance[node];
        RSS(ref_metric_step_exp(s, &h, h0, h1, h2, s1, s2, width), "step exp");
        m[0] = 1.0 / (h * h);
        m[1] = 0.0;
        m[2] = 0.0;
        m[3] = 1.0 / (h * h);
        m[4] = 0.0;
        m[5] = 1.0 / (h * h);
        if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
        RSS(ref_node_metric_set(ref_node, node, m), "set");
      }
    }
  }

  if (have_spacing_table) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL m[6];
      REF_DBL d[12];
      REF_DBL h;
      REF_DBL dist = distance[node];
      REF_INT i0, i1;
      REF_DBL t0, t1;
      RSS(ref_sort_search_dbl(n_tab, tab_dist, dist, &i0),
          "first index on range");
      i1 = i0 + 1;
      t1 = 0.0;
      if (ref_math_divisible((dist - tab_dist[i0]),
                             (tab_dist[i1] - tab_dist[i0]))) {
        t1 = (dist - tab_dist[i0]) / (tab_dist[i1] - tab_dist[i0]);
      }
      t1 = MIN(MAX(0.0, t1), 1.0);
      t0 = 1.0 - t1;
      h = t0 * tab_h[i0] + t1 * tab_h[i1];
      aspect_ratio = t0 * tab_ar[i0] + t1 * tab_ar[i1];
      ref_matrix_eig(d, 0) = 1.0 / (h * h);
      ref_matrix_eig(d, 1) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
      ref_matrix_eig(d, 2) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
      ref_matrix_vec(d, 0, 0) = grad_dist[0 + 3 * node];
      ref_matrix_vec(d, 1, 0) = grad_dist[1 + 3 * node];
      ref_matrix_vec(d, 2, 0) = grad_dist[2 + 3 * node];
      if (REF_SUCCESS == ref_math_normalize(&(d[3]))) {
        RSS(ref_math_orthonormal_system(&(d[3]), &(d[6]), &(d[9])),
            "ortho sys");
        RSS(ref_matrix_form_m(d, m), "form m from d");
      } else {
        m[0] = 1.0 / (h * h);
        m[1] = 0.0;
        m[2] = 0.0;
        m[3] = 1.0 / (h * h);
        m[4] = 0.0;
        m[5] = 1.0 / (h * h);
      }
      if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
      RSB(ref_node_metric_set(ref_node, node, m), "set", {
        printf("dist %f h %f ar %f t0 %f t1 %f i0 %d i1 %d\n", dist, h,
               aspect_ratio, t0, t1, i0, i1);
        printf("tab_h[i0] %f tab_h[i1] %f tab_h[i0] %f tab_h[i1] %f\n",
               tab_dist[i0], tab_dist[i1], tab_h[i0], tab_h[i1]);
      });
    }

    ref_free(tab_ar);
    ref_free(tab_h);
    ref_free(tab_dist);
  }

  ref_free(grad_dist);
  ref_free(distance);
  return REF_SUCCESS;
}